

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall httplib::ThreadPool::enqueue(ThreadPool *this,function<void_()> *fn)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->mutex_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
  _M_insert<std::function<void()>>
            ((list<std::function<void()>,std::allocator<std::function<void()>>> *)&this->jobs_,
             (iterator)&this->jobs_,fn);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void enqueue(std::function<void()> fn) override {
    {
      std::unique_lock<std::mutex> lock(mutex_);
      jobs_.push_back(std::move(fn));
    }

    cond_.notify_one();
  }